

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRunner.cpp
# Opt level: O0

int __thiscall UnitTest::TestRunner::Finish(TestRunner *this)

{
  TestReporter *pTVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  double dVar6;
  float secondsElapsed;
  TestRunner *this_local;
  
  dVar6 = Timer::GetTimeInMs(this->m_timer);
  pTVar1 = this->m_reporter;
  uVar2 = TestResults::GetTotalTestCount(this->m_result);
  uVar3 = TestResults::GetFailedTestCount(this->m_result);
  uVar4 = TestResults::GetFailureCount(this->m_result);
  (*pTVar1->_vptr_TestReporter[5])
            ((ulong)(uint)(float)(dVar6 / 1000.0),pTVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  iVar5 = TestResults::GetFailureCount(this->m_result);
  return iVar5;
}

Assistant:

int TestRunner::Finish() const
{
    float const secondsElapsed = static_cast<float>(m_timer->GetTimeInMs() / 1000.0);
    m_reporter->ReportSummary(m_result->GetTotalTestCount(), 
							  m_result->GetFailedTestCount(), 
							  m_result->GetFailureCount(), 
							  secondsElapsed);
    
	return m_result->GetFailureCount();
}